

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void nlohmann::detail::dtoa_impl::grisu2
               (char *buf,int *len,int *decimal_exponent,diyfp m_minus,diyfp v,diyfp m_plus)

{
  diyfp w;
  diyfp M_plus;
  cached_power cVar1;
  diyfp dVar2;
  diyfp dVar3;
  diyfp dVar4;
  diyfp c_minus_k;
  undefined4 uStack_64;
  undefined4 uStack_54;
  diyfp local_50;
  diyfp local_40;
  
  local_50.f = m_minus.f;
  local_50.e = m_minus.e;
  if (m_plus.e != local_50.e) {
    __assert_fail("m_plus.e == m_minus.e",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x237e,
                  "void nlohmann::detail::dtoa_impl::grisu2(char *, int &, int &, diyfp, diyfp, diyfp)"
                 );
  }
  if (v.e == local_50.e) {
    cVar1 = get_cached_power_for_binary_exponent(local_50.e);
    local_40.f = cVar1.f;
    local_40.e = cVar1.e;
    dVar2 = diyfp::mul(&v,&local_40);
    dVar3 = diyfp::mul(&local_50,&local_40);
    dVar4 = diyfp::mul(&m_plus,&local_40);
    *decimal_exponent = -cVar1.k;
    M_plus._12_4_ = uStack_64;
    M_plus.e = dVar4.e;
    w._12_4_ = uStack_54;
    w.e = dVar2.e;
    w.f = dVar2.f;
    M_plus.f = dVar4.f - 1;
    dVar2.e = dVar3.e;
    dVar2.f = dVar3.f + 1;
    dVar2._12_4_ = 0;
    grisu2_digit_gen(buf,len,decimal_exponent,dVar2,w,M_plus);
    return;
  }
  __assert_fail("m_plus.e == v.e",
                "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                ,0x237f,
                "void nlohmann::detail::dtoa_impl::grisu2(char *, int &, int &, diyfp, diyfp, diyfp)"
               );
}

Assistant:

inline void grisu2(char* buf, int& len, int& decimal_exponent, diyfp m_minus, diyfp v, diyfp m_plus) {
	assert(m_plus.e == m_minus.e);
	assert(m_plus.e == v.e);

	//  --------(-----------------------+-----------------------)--------    (A)
	//          m-                      v                       m+
	//
	//  --------------------(-----------+-----------------------)--------    (B)
	//                      m-          v                       m+
	//
	// First scale v (and m- and m+) such that the exponent is in the range
	// [alpha, gamma].

	const cached_power cached = get_cached_power_for_binary_exponent(m_plus.e);

	const diyfp c_minus_k(cached.f, cached.e);  // = c ~= 10^-k

	// The exponent of the products is = v.e + c_minus_k.e + q and is in the range [alpha,gamma]
	const diyfp w = diyfp::mul(v, c_minus_k);
	const diyfp w_minus = diyfp::mul(m_minus, c_minus_k);
	const diyfp w_plus = diyfp::mul(m_plus, c_minus_k);

	//  ----(---+---)---------------(---+---)---------------(---+---)----
	//          w-                      w                       w+
	//          = c*m-                  = c*v                   = c*m+
	//
	// diyfp::mul rounds its result and c_minus_k is approximated too. w, w- and
	// w+ are now off by a small amount.
	// In fact:
	//
	//      w - v * 10^k < 1 ulp
	//
	// To account for this inaccuracy, add resp. subtract 1 ulp.
	//
	//  --------+---[---------------(---+---)---------------]---+--------
	//          w-  M-                  w                   M+  w+
	//
	// Now any number in [M-, M+] (bounds included) will round to w when input,
	// regardless of how the input rounding algorithm breaks ties.
	//
	// And digit_gen generates the shortest possible such number in [M-, M+].
	// Note that this does not mean that Grisu2 always generates the shortest
	// possible number in the interval (m-, m+).
	const diyfp M_minus(w_minus.f + 1, w_minus.e);
	const diyfp M_plus(w_plus.f - 1, w_plus.e);

	decimal_exponent = -cached.k;  // = -(-k) = k

	grisu2_digit_gen(buf, len, decimal_exponent, M_minus, w, M_plus);
}